

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayer.cpp
# Opt level: O0

ILayer * __thiscall
ILayer::BindWithNext(ILayer *this,ILayer *nextLayer,ISynapseBuilder *synapseBuilder)

{
  INeuron *this_00;
  size_t sVar1;
  size_t sVar2;
  reference ppIVar3;
  INeuron *this_01;
  ISynapse *synapse;
  ISynapse *synapsePtr;
  INeuron *next;
  INeuron *prev;
  int nextId;
  int prevId;
  size_t size2;
  size_t size1;
  ISynapseBuilder *synapseBuilder_local;
  ILayer *nextLayer_local;
  ILayer *this_local;
  
  sVar1 = GetSize(this);
  sVar2 = GetSize(nextLayer);
  for (prev._4_4_ = 0; (ulong)(long)prev._4_4_ < sVar1; prev._4_4_ = prev._4_4_ + 1) {
    for (prev._0_4_ = 0; (ulong)(long)(int)prev < sVar2; prev._0_4_ = (int)prev + 1) {
      ppIVar3 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::operator[]
                          (&this->neurons,(long)prev._4_4_);
      this_00 = *ppIVar3;
      this_01 = operator[](nextLayer,(long)(int)prev);
      synapse = (ISynapse *)
                (**(code **)(*(long *)synapseBuilder + 0x10))
                          (synapseBuilder,sVar1,sVar2,this_00,this_01);
      INeuron::AddOutputSynapse(this_00,synapse);
      INeuron::AddInputSynapse(this_01,synapse);
    }
  }
  return this;
}

Assistant:

ILayer &ILayer::BindWithNext( ILayer &nextLayer, const ISynapseBuilder &synapseBuilder )
{
    size_t size1 = GetSize();
    size_t size2 = nextLayer.GetSize();
    for ( int prevId = 0; prevId < size1; prevId++ ) {
        for ( int nextId = 0; nextId < size2; nextId++ ) {
            INeuron *prev = neurons[prevId];
            INeuron *next = nextLayer[nextId];
            ISynapse *synapsePtr = synapseBuilder.Build( size1, size2, prev, next );
            prev->AddOutputSynapse( synapsePtr );
            next->AddInputSynapse( synapsePtr );
        }
    }
    return *this;
}